

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

bool QUtil::pdf_time_to_iso8601(string *pdf_time,string *iso8601)

{
  bool bVar1;
  QPDFTime *qtm_00;
  string local_60;
  undefined1 local_3c [8];
  QPDFTime qtm;
  string *iso8601_local;
  string *pdf_time_local;
  
  qtm._20_8_ = iso8601;
  bVar1 = pdf_time_to_qpdf_time(pdf_time,(QPDFTime *)local_3c);
  if (bVar1) {
    qpdf_time_to_iso8601_abi_cxx11_(&local_60,(QUtil *)local_3c,qtm_00);
    std::__cxx11::string::operator=((string *)qtm._20_8_,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return bVar1;
}

Assistant:

bool
QUtil::pdf_time_to_iso8601(std::string const& pdf_time, std::string& iso8601)
{
    QPDFTime qtm;
    if (pdf_time_to_qpdf_time(pdf_time, &qtm)) {
        iso8601 = qpdf_time_to_iso8601(qtm);
        return true;
    }
    return false;
}